

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::decoder_etc_block::get_block_colors5_g
               (int *pBlock_colors,color32 *base_color5,uint32_t inten_table)

{
  int iVar1;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  int iVar2;
  int iVar3;
  int iVar4;
  
  bVar5 = (base_color5->field_0).field_0.g;
  uVar7 = (uint)(bVar5 >> 2) | (uint)bVar5 * 8;
  uVar6 = (ulong)inten_table;
  iVar1 = (uint)(0 < (int)(uVar7 + (&g_etc1_inten_tables)[uVar6 * 4])) *
          (uVar7 + (&g_etc1_inten_tables)[uVar6 * 4]);
  iVar2 = (uint)(0 < (int)(uVar7 + (&DAT_002666f4)[uVar6 * 4])) *
          (uVar7 + (&DAT_002666f4)[uVar6 * 4]);
  iVar3 = (uint)(0 < (int)(uVar7 + (&DAT_002666f8)[uVar6 * 4])) *
          (uVar7 + (&DAT_002666f8)[uVar6 * 4]);
  iVar4 = (uint)(0 < (int)(uVar7 + (&DAT_002666fc)[uVar6 * 4])) *
          (uVar7 + (&DAT_002666fc)[uVar6 * 4]);
  *pBlock_colors = (uint)(0xff < iVar1) * 0xff | (uint)(0xff >= iVar1) * iVar1;
  pBlock_colors[1] = (uint)(0xff < iVar2) * 0xff | (uint)(0xff >= iVar2) * iVar2;
  pBlock_colors[2] = (uint)(0xff < iVar3) * 0xff | (uint)(0xff >= iVar3) * iVar3;
  pBlock_colors[3] = (uint)(0xff < iVar4) * 0xff | (uint)(0xff >= iVar4) * iVar4;
  return;
}

Assistant:

static void get_block_colors5_g(int* pBlock_colors, const color32& base_color5, uint32_t inten_table)
		{
			const int g = (base_color5.g << 3) | (base_color5.g >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0] = clamp255(g + pInten_table[0]);
			pBlock_colors[1] = clamp255(g + pInten_table[1]);
			pBlock_colors[2] = clamp255(g + pInten_table[2]);
			pBlock_colors[3] = clamp255(g + pInten_table[3]);
		}